

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O2

double __thiscall
TankMixModel::findLIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  double dVar1;
  Segment *pSVar2;
  Segment *pSVar3;
  SystemError *this_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (vNet <= 0.0) {
    if (0.0 <= vNet) {
      return this->cTank;
    }
    dVar4 = -vNet;
    dVar6 = 0.0;
    dVar7 = 0.0;
    while ((0.0 < dVar4 && (pSVar3 = this->firstSeg, pSVar3 != (Segment *)0x0))) {
      dVar1 = pSVar3->v;
      pSVar2 = pSVar3->next;
      dVar5 = dVar4;
      if ((pSVar2 != (Segment *)0x0) && (dVar1 <= dVar4)) {
        dVar5 = dVar1;
      }
      dVar7 = dVar7 + dVar5;
      dVar6 = dVar6 + pSVar3->c * dVar5;
      dVar4 = dVar4 - dVar5;
      if (((pSVar2 == (Segment *)0x0) || (dVar4 < 0.0)) || (dVar5 < dVar1)) {
        pSVar3->v = dVar1 - dVar5;
      }
      else {
        this->firstSeg = pSVar2;
        SegPool::freeSegment(segPool,pSVar3);
      }
    }
    dVar4 = (dVar6 + wIn) / (dVar7 + vIn);
  }
  else {
    pSVar3 = this->firstSeg;
    if ((pSVar3 == (Segment *)0x0) || (dVar4 = pSVar3->c, this->cTol <= ABS(dVar4 - wIn / vIn))) {
      pSVar3 = SegPool::getSegment(segPool,vNet,wIn / vIn);
      if (pSVar3 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
      }
      pSVar3->next = this->firstSeg;
      this->firstSeg = pSVar3;
      dVar4 = pSVar3->c;
    }
    else {
      pSVar3->v = vNet + pSVar3->v;
    }
  }
  this->cTank = dVar4;
  return dVar4;
}

Assistant:

double TankMixModel::findLIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... if filling then create a new first segment
    if ( vNet > 0.0 )
    {
        // ... increase current first segment volume if inflow has same quality
        double cIn = wIn / vIn;
        if ( firstSeg && abs(firstSeg->c - cIn ) < cTol ) firstSeg->v += vNet;

        // ... otherwise add a new first segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vNet, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            seg->next = firstSeg;
            firstSeg = seg;
        }
        cTank = firstSeg->c;
    }

    // ... if emptying then remove first segments until vNet is reached
    else if ( vNet < 0.0 )
    {
        double vSum = 0.0;
        double wSum = 0.0;
        vNet = -vNet;
        while ( vNet > 0.0 )
        {
            Segment* seg = firstSeg;
            if ( seg == nullptr ) break;
            double vSeg = min(seg->v, vNet);
            if ( seg->next == nullptr ) vSeg = vNet;
            vSum += vSeg;
            wSum += seg->c * vSeg;
            vNet -= vSeg;
            if ( vNet >= 0.0 && vSeg >= seg->v && seg->next )
            {
                firstSeg = seg->next;
                segPool->freeSegment(seg);
            }
            else seg->v -= vSeg;
        }

        // ... avg. quality released is mixture of quality in flow
        //     released and any inflow
        cTank = (wSum + wIn) / (vSum + vIn);
    }
    return cTank;
 }